

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheRelease(PgHdr *p)

{
  PgHdr *in_RDI;
  
  in_RDI->nRef = in_RDI->nRef + -1;
  if (in_RDI->nRef == 0) {
    in_RDI->pCache->nRef = in_RDI->pCache->nRef + -1;
    if ((in_RDI->flags & 2) == 0) {
      pcacheUnpin((PgHdr *)0x131c4c);
    }
    else if (in_RDI->pDirtyPrev != (PgHdr *)0x0) {
      pcacheManageDirtyList(in_RDI,'\x03');
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->nRef--;
  if( p->nRef==0 ){
    p->pCache->nRef--;
    if( (p->flags&PGHDR_DIRTY)==0 ){
      pcacheUnpin(p);
    }else if( p->pDirtyPrev!=0 ){
      /* Move the page to the head of the dirty list. */
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    }
  }
}